

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

AST * jsonnet::internal::left_recursive_deep(AST *ast_)

{
  AST *pAVar1;
  AST *ast__00;
  
  pAVar1 = left_recursive(ast_);
  while (ast__00 = pAVar1, ast__00 != (AST *)0x0) {
    pAVar1 = left_recursive(ast__00);
    ast_ = ast__00;
  }
  return ast_;
}

Assistant:

static AST *left_recursive_deep(AST *ast_)
{
    AST *last = ast_;
    AST *left = left_recursive(ast_);

    while (left != nullptr) {
        last = left;
        left = left_recursive(last);
    }
    return last;
}